

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_asn1.c
# Opt level: O0

int_dhx942_dh * d2i_int_dhx(int_dhx942_dh **a,uchar **in,long len)

{
  ASN1_ITEM *it;
  int_dhx942_dh *piVar1;
  long in_RDX;
  uchar **in_RSI;
  ASN1_VALUE **in_RDI;
  
  it = (ASN1_ITEM *)DHxparams_it();
  piVar1 = (int_dhx942_dh *)ASN1_item_d2i(in_RDI,in_RSI,in_RDX,it);
  return piVar1;
}

Assistant:

DH *d2i_DHxparams(DH **a, const unsigned char **pp, long length)
{
    FFC_PARAMS *params;
    int_dhx942_dh *dhx = NULL;
    DH *dh = NULL;

    dh = DH_new();
    if (dh == NULL)
        return NULL;
    dhx = d2i_int_dhx(NULL, pp, length);
    if (dhx == NULL) {
        DH_free(dh);
        return NULL;
    }

    if (a != NULL) {
        DH_free(*a);
        *a = dh;
    }

    params = &dh->params;
    DH_set0_pqg(dh, dhx->p, dhx->q, dhx->g);
    ossl_ffc_params_set0_j(params, dhx->j);

    if (dhx->vparams != NULL) {
        /* The counter has a maximum value of 4 * numbits(p) - 1 */
        size_t counter = (size_t)BN_get_word(dhx->vparams->counter);
        ossl_ffc_params_set_validate_params(params, dhx->vparams->seed->data,
                                            dhx->vparams->seed->length,
                                            counter);
        ASN1_BIT_STRING_free(dhx->vparams->seed);
        BN_free(dhx->vparams->counter);
        OPENSSL_free(dhx->vparams);
        dhx->vparams = NULL;
    }

    OPENSSL_free(dhx);
    DH_clear_flags(dh, DH_FLAG_TYPE_MASK);
    DH_set_flags(dh, DH_FLAG_TYPE_DHX);
    return dh;
}